

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O0

void Cnf_DataWriteIntoFile
               (Cnf_Dat_t *p,char *pFileName,int fReadable,Vec_Int_t *vForAlls,Vec_Int_t *vExists)

{
  int *piVar1;
  int iVar2;
  size_t sVar3;
  FILE *__stream;
  uint local_94;
  uint local_84;
  uint local_6c;
  int local_4c;
  int VarId;
  int i;
  int *pStop;
  int *pLit;
  FILE *pFile;
  Vec_Int_t *vExists_local;
  Vec_Int_t *vForAlls_local;
  int fReadable_local;
  char *pFileName_local;
  Cnf_Dat_t *p_local;
  
  sVar3 = strlen(pFileName);
  iVar2 = strncmp(pFileName + (sVar3 - 3),".gz",3);
  if (iVar2 == 0) {
    Cnf_DataWriteIntoFileGz(p,pFileName,fReadable,vForAlls,vExists);
  }
  else {
    __stream = fopen(pFileName,"w");
    if (__stream == (FILE *)0x0) {
      printf("Cnf_WriteIntoFile(): Output file cannot be opened.\n");
    }
    else {
      fprintf(__stream,"c Result of efficient AIG-to-CNF conversion using package CNF\n");
      fprintf(__stream,"p cnf %d %d\n",(ulong)(uint)p->nVars,(ulong)(uint)p->nClauses);
      if (vForAlls != (Vec_Int_t *)0x0) {
        fprintf(__stream,"a ");
        for (local_4c = 0; iVar2 = Vec_IntSize(vForAlls), local_4c < iVar2; local_4c = local_4c + 1)
        {
          local_6c = Vec_IntEntry(vForAlls,local_4c);
          if (fReadable == 0) {
            local_6c = local_6c + 1;
          }
          fprintf(__stream,"%d ",(ulong)local_6c);
        }
        fprintf(__stream,"0\n");
      }
      if (vExists != (Vec_Int_t *)0x0) {
        fprintf(__stream,"e ");
        for (local_4c = 0; iVar2 = Vec_IntSize(vExists), local_4c < iVar2; local_4c = local_4c + 1)
        {
          local_84 = Vec_IntEntry(vExists,local_4c);
          if (fReadable == 0) {
            local_84 = local_84 + 1;
          }
          fprintf(__stream,"%d ",(ulong)local_84);
        }
        fprintf(__stream,"0\n");
      }
      for (local_4c = 0; local_4c < p->nClauses; local_4c = local_4c + 1) {
        piVar1 = p->pClauses[local_4c + 1];
        for (pStop = p->pClauses[local_4c]; pStop < piVar1; pStop = pStop + 1) {
          if (fReadable == 0) {
            local_94 = Cnf_Lit2Var(*pStop);
          }
          else {
            local_94 = Cnf_Lit2Var2(*pStop);
          }
          fprintf(__stream,"%d ",(ulong)local_94);
        }
        fprintf(__stream,"0\n");
      }
      fprintf(__stream,"\n");
      fclose(__stream);
    }
  }
  return;
}

Assistant:

void Cnf_DataWriteIntoFile( Cnf_Dat_t * p, char * pFileName, int fReadable, Vec_Int_t * vForAlls, Vec_Int_t * vExists )
{
    FILE * pFile;
    int * pLit, * pStop, i, VarId;
    if ( !strncmp(pFileName+strlen(pFileName)-3,".gz",3) ) 
    {
        Cnf_DataWriteIntoFileGz( p, pFileName, fReadable, vForAlls, vExists );
        return;
    }
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Cnf_WriteIntoFile(): Output file cannot be opened.\n" );
        return;
    }
    fprintf( pFile, "c Result of efficient AIG-to-CNF conversion using package CNF\n" );
    fprintf( pFile, "p cnf %d %d\n", p->nVars, p->nClauses );
    if ( vForAlls )
    {
        fprintf( pFile, "a " );
        Vec_IntForEachEntry( vForAlls, VarId, i )
            fprintf( pFile, "%d ", fReadable? VarId : VarId+1 );
        fprintf( pFile, "0\n" );
    }
    if ( vExists )
    {
        fprintf( pFile, "e " );
        Vec_IntForEachEntry( vExists, VarId, i )
            fprintf( pFile, "%d ", fReadable? VarId : VarId+1 );
        fprintf( pFile, "0\n" );
    }
    for ( i = 0; i < p->nClauses; i++ )
    {
        for ( pLit = p->pClauses[i], pStop = p->pClauses[i+1]; pLit < pStop; pLit++ )
            fprintf( pFile, "%d ", fReadable? Cnf_Lit2Var2(*pLit) : Cnf_Lit2Var(*pLit) );
        fprintf( pFile, "0\n" );
    }
    fprintf( pFile, "\n" );
    fclose( pFile );
}